

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall RandStrAltList::generate(RandStrAltList *this,wchar_t **dst)

{
  RandStrNode *pRVar1;
  uint32_t uVar2;
  int iVar3;
  ulong uVar4;
  RandStrNode **ppRVar5;
  
  uVar2 = rng_next();
  uVar4 = rand_range((ulong)uVar2,(long)this->altCount);
  ppRVar5 = &(this->super_RandStrNode).firstChild;
  while( true ) {
    pRVar1 = *ppRVar5;
    iVar3 = (int)uVar4;
    uVar4 = (ulong)(iVar3 - 1);
    if ((iVar3 == 0) || (pRVar1 == (RandStrNode *)0x0)) break;
    ppRVar5 = &pRVar1->nextSibling;
  }
  if (pRVar1 != (RandStrNode *)0x0) {
    (*pRVar1->_vptr_RandStrNode[3])(pRVar1,dst);
    return;
  }
  return;
}

Assistant:

virtual void generate(VMG_ wchar_t *&dst)
    {
        /* pick one of our alternatives at random */
        int n = rand_range(rng_next(vmg0_), altCount);

        /* find it and generate it */
        RandStrNode *chi;
        for (chi = firstChild ; n != 0 && chi != 0 ;
             --n, chi = chi->nextSibling) ;

        /* generate the expression */
        if (chi != 0)
            chi->generate(vmg_ dst);
    }